

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O1

void __thiscall testing::internal::GTestFlagSaver::~GTestFlagSaver(GTestFlagSaver *this)

{
  pointer pcVar1;
  
  FLAGS_gtest_also_run_disabled_tests = this->also_run_disabled_tests_;
  FLAGS_gtest_break_on_failure = this->break_on_failure_;
  FLAGS_gtest_catch_exceptions = this->catch_exceptions_;
  std::__cxx11::string::_M_assign((string *)&FLAGS_gtest_color_abi_cxx11_);
  std::__cxx11::string::_M_assign((string *)FLAGS_gtest_death_test_style_abi_cxx11_);
  FLAGS_gtest_death_test_use_fork = this->death_test_use_fork_;
  std::__cxx11::string::_M_assign((string *)&FLAGS_gtest_filter_abi_cxx11_);
  std::__cxx11::string::_M_assign((string *)&FLAGS_gtest_internal_run_death_test_abi_cxx11_);
  FLAGS_gtest_list_tests = this->list_tests_;
  std::__cxx11::string::_M_assign((string *)&FLAGS_gtest_output_abi_cxx11_);
  FLAGS_gtest_print_time = this->print_time_;
  FLAGS_gtest_random_seed = this->random_seed_;
  FLAGS_gtest_repeat = this->repeat_;
  FLAGS_gtest_shuffle = this->shuffle_;
  FLAGS_gtest_stack_trace_depth = this->stack_trace_depth_;
  std::__cxx11::string::_M_assign((string *)&FLAGS_gtest_stream_result_to_abi_cxx11_);
  FLAGS_gtest_throw_on_failure = this->throw_on_failure_;
  pcVar1 = (this->stream_result_to_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->stream_result_to_).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->output_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->output_).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->internal_run_death_test_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->internal_run_death_test_).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->filter_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->filter_).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->death_test_style_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->death_test_style_).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->color_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->color_).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

~GTestFlagSaver() {
    GTEST_FLAG(also_run_disabled_tests) = also_run_disabled_tests_;
    GTEST_FLAG(break_on_failure) = break_on_failure_;
    GTEST_FLAG(catch_exceptions) = catch_exceptions_;
    GTEST_FLAG(color) = color_;
    GTEST_FLAG(death_test_style) = death_test_style_;
    GTEST_FLAG(death_test_use_fork) = death_test_use_fork_;
    GTEST_FLAG(filter) = filter_;
    GTEST_FLAG(internal_run_death_test) = internal_run_death_test_;
    GTEST_FLAG(list_tests) = list_tests_;
    GTEST_FLAG(output) = output_;
    GTEST_FLAG(print_time) = print_time_;
    GTEST_FLAG(random_seed) = random_seed_;
    GTEST_FLAG(repeat) = repeat_;
    GTEST_FLAG(shuffle) = shuffle_;
    GTEST_FLAG(stack_trace_depth) = stack_trace_depth_;
    GTEST_FLAG(stream_result_to) = stream_result_to_;
    GTEST_FLAG(throw_on_failure) = throw_on_failure_;
  }